

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ConstCastTestT<unsigned_long_long>(void)

{
  int iVar1;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar2;
  unsigned_long_long local_10;
  
  if (ConstCastTestT<unsigned_long_long>()::b == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::b);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<unsigned_long_long>();
      ConstCastTestT<unsigned_long_long>::b = SVar2.m_int != 0;
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::b);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::w == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::w);
    if (iVar1 != 0) {
      local_10 = (unsigned_long_long)ConstSafeInt<unsigned_long_long>();
      ConstCastTestT<unsigned_long_long>::w =
           SafeInt::operator_cast_to_wchar_t((SafeInt *)&local_10);
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::w);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::c == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::c);
    if (iVar1 != 0) {
      local_10 = (unsigned_long_long)ConstSafeInt<unsigned_long_long>();
      ConstCastTestT<unsigned_long_long>::c = SafeInt::operator_cast_to_char((SafeInt *)&local_10);
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::c);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::sc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::sc);
    if (iVar1 != 0) {
      local_10 = (unsigned_long_long)ConstSafeInt<unsigned_long_long>();
      ConstCastTestT<unsigned_long_long>::sc =
           SafeInt::operator_cast_to_signed_char((SafeInt *)&local_10);
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::sc);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::uc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::uc);
    if (iVar1 != 0) {
      local_10 = (unsigned_long_long)ConstSafeInt<unsigned_long_long>();
      ConstCastTestT<unsigned_long_long>::uc =
           SafeInt::operator_cast_to_unsigned_char((SafeInt *)&local_10);
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::uc);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::s == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::s);
    if (iVar1 != 0) {
      local_10 = (unsigned_long_long)ConstSafeInt<unsigned_long_long>();
      ConstCastTestT<unsigned_long_long>::s = SafeInt::operator_cast_to_short((SafeInt *)&local_10);
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::s);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::us == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::us);
    if (iVar1 != 0) {
      local_10 = (unsigned_long_long)ConstSafeInt<unsigned_long_long>();
      ConstCastTestT<unsigned_long_long>::us =
           SafeInt::operator_cast_to_unsigned_short((SafeInt *)&local_10);
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::us);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::i == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::i);
    if (iVar1 != 0) {
      local_10 = (unsigned_long_long)ConstSafeInt<unsigned_long_long>();
      ConstCastTestT<unsigned_long_long>::i = SafeInt::operator_cast_to_int((SafeInt *)&local_10);
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::i);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::ui == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::ui);
    if (iVar1 != 0) {
      local_10 = (unsigned_long_long)ConstSafeInt<unsigned_long_long>();
      ConstCastTestT<unsigned_long_long>::ui =
           SafeInt::operator_cast_to_unsigned_int((SafeInt *)&local_10);
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::ui);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::l == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::l);
    if (iVar1 != 0) {
      local_10 = (unsigned_long_long)ConstSafeInt<unsigned_long_long>();
      ConstCastTestT<unsigned_long_long>::l = SafeInt::operator_cast_to_long((SafeInt *)&local_10);
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::l);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::ul == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::ul);
    if (iVar1 != 0) {
      ConstCastTestT<unsigned_long_long>::ul = (unsigned_long)ConstSafeInt<unsigned_long_long>();
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::ul);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::ll == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::ll);
    if (iVar1 != 0) {
      local_10 = (unsigned_long_long)ConstSafeInt<unsigned_long_long>();
      ConstCastTestT<unsigned_long_long>::ll =
           SafeInt::operator_cast_to_long_long((SafeInt *)&local_10);
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::ll);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::ull == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::ull);
    if (iVar1 != 0) {
      ConstCastTestT<unsigned_long_long>::ull =
           (unsigned_long_long)ConstSafeInt<unsigned_long_long>();
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::ull);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::st == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::st);
    if (iVar1 != 0) {
      ConstCastTestT<unsigned_long_long>::st = (size_t)ConstSafeInt<unsigned_long_long>();
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::st);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::pt == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::pt);
    if (iVar1 != 0) {
      local_10 = (unsigned_long_long)ConstSafeInt<unsigned_long_long>();
      ConstCastTestT<unsigned_long_long>::pt = SafeInt::operator_cast_to_long((SafeInt *)&local_10);
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::pt);
    }
  }
  if (ConstCastTestT<unsigned_long_long>()::pl == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_long_long>()::pl);
    if (iVar1 != 0) {
      local_10 = (unsigned_long_long)ConstSafeInt<unsigned_long_long>();
      ConstCastTestT<unsigned_long_long>::pl = SafeInt::operator_cast_to_int((SafeInt *)&local_10);
      __cxa_guard_release(&ConstCastTestT<unsigned_long_long>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}